

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  size_t __n;
  byte bVar1;
  ushort uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  int iVar7;
  Amap_Cut_t AVar8;
  ulong uVar9;
  Amap_Cut_t *pAVar10;
  Amap_Cut_t **ppAVar11;
  long lVar12;
  ulong uVar13;
  Amap_Set_t *pAVar14;
  Amap_Cut_t *pAVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Amap_Mat_t local_98;
  Amap_Cut_t *local_78;
  Amap_Set_t *pAStack_70;
  undefined1 auStack_68 [8];
  float fStack_60;
  undefined4 uStack_5c;
  Amap_Cut_t *local_58;
  Amap_Set_t *pAStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar25 [16];
  
  pAStack_50 = (Amap_Set_t *)0x0;
  uStack_48 = 0;
  uStack_40 = 0;
  pAStack_70 = (Amap_Set_t *)0x0;
  _auStack_68 = ZEXT816(0);
  if (fRefs == 0) {
    pNode->EstRefs = (float)pNode->nRefs;
  }
  else {
    iVar7 = pNode->nFouts[1] + pNode->nFouts[0];
    pNode->EstRefs = (pNode->EstRefs + pNode->EstRefs + (float)iVar7) / 3.0;
    if (0 < iVar7) {
      Amap_CutAreaDeref(p,&pNode->Best);
    }
  }
  iVar7 = 0;
  local_78 = (Amap_Cut_t *)0x0;
  local_58 = (Amap_Cut_t *)0x0;
  uVar19 = pNode->nCuts;
  if ((int)uVar19 < 1) {
    fVar30 = 0.0;
    fVar29 = 0.0;
    uVar20 = 0;
    fVar22 = 0.0;
    fVar21 = 0.0;
  }
  else {
    pAVar15 = (Amap_Cut_t *)(pNode->field_11).pData;
    do {
      AVar8 = *pAVar15;
      uVar9 = (ulong)(uint)AVar8;
      if ((((uint)AVar8 & 0xffff) != 0) &&
         (pAVar14 = p->pLib->pNodes[uVar9 & 0xffff].pSets, pAVar14 != (Amap_Set_t *)0x0)) {
        do {
          local_98.Area = 0.0;
          local_98.AveFan = 0.0;
          local_98.Delay = 0.0;
          local_98._28_4_ = 0;
          uVar2 = *(ushort *)&pAVar14->field_0x8;
          pVVar3 = p->pLib->vGates;
          local_98.pCut = pAVar15;
          local_98.pSet = pAVar14;
          if (fFlow == 0) {
            if (pVVar3->nSize <= (int)(uint)uVar2) goto LAB_00442d81;
            uVar19 = (uint)(uVar9 >> 0x11);
            if (*(byte *)((long)pVVar3->pArray[uVar2] + 0x3b) != uVar19) {
              __assert_fail("pGate->nPins == pM->pCut->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                            ,0x1ec,
                            "void Amap_ManMatchGetExacts(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)")
              ;
            }
            fVar29 = 0.0;
            fVar30 = 1.0;
            if (0x1ffff < (uint)uVar9) {
              fVar30 = 0.0;
              uVar13 = 0;
              do {
                if ((pAVar14->Ins[uVar13] < '\0') ||
                   (uVar16 = *(uint *)((long)&pAVar15[1].field_0x0 +
                                      (ulong)((byte)pAVar14->Ins[uVar13] & 0xfffffffe) * 2),
                   (int)uVar16 < 0)) goto LAB_00442d62;
                uVar16 = uVar16 >> 1;
                if (p->vObjs->nSize <= (int)uVar16) goto LAB_00442d81;
                pvVar5 = p->vObjs->pArray[uVar16];
                iVar17 = (int)fVar30;
                if ((int)fVar30 <= (int)*(float *)((long)pvVar5 + 0x58)) {
                  iVar17 = (int)*(float *)((long)pvVar5 + 0x58);
                }
                fVar30 = (float)iVar17;
                fVar29 = fVar29 + (float)(*(int *)((long)pvVar5 + 0x38) +
                                         *(int *)((long)pvVar5 + 0x34));
                uVar13 = uVar13 + 1;
              } while (uVar9 >> 0x11 != uVar13);
              fVar30 = fVar30 + 1.0;
            }
            fVar29 = fVar29 / (float)uVar19;
            pVVar3 = p->vTempP;
            pVVar3->nSize = 0;
            local_98.AveFan = fVar29;
            local_98.Delay = fVar30;
            local_98.Area = Amap_CutAreaRef2(p,&local_98,pVVar3,8);
            pVVar3 = p->vTempP;
            if (0 < pVVar3->nSize) {
              ppvVar4 = pVVar3->pArray;
              lVar12 = 0;
              do {
                *(int *)ppvVar4[lVar12] = *ppvVar4[lVar12] + -1;
                lVar12 = lVar12 + 1;
              } while (lVar12 < pVVar3->nSize);
            }
            uVar9 = (ulong)(uint)*pAVar15;
            uVar19 = (*(uint *)&pAVar14->field_0x8 ^ (uint)*pAVar15) >> 0x10 & 1;
            if ((pNode->nFouts[uVar19] == 0) && (0 < pNode->nFouts[uVar19 ^ 1])) {
              local_98.Area = local_98.Area + p->fAreaInv;
            }
          }
          else {
            if (pVVar3->nSize <= (int)(uint)uVar2) {
LAB_00442d81:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            bVar1 = *(byte *)((long)pVVar3->pArray[uVar2] + 0x3b);
            if ((uint)bVar1 != (uint)(uVar9 >> 0x11)) {
              __assert_fail("pGate->nPins == pM->pCut->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                            ,0x1c2,"void Amap_ManMatchGetFlows(Amap_Man_t *, Amap_Mat_t *)");
            }
            fVar21 = (float)*(double *)((long)pVVar3->pArray[uVar2] + 0x20);
            fVar29 = 0.0;
            if ((uint)uVar9 < 0x20000) {
              fVar30 = 1.0;
              local_98.Area = fVar21;
            }
            else {
              fVar30 = 0.0;
              uVar13 = 0;
              fVar22 = fVar21;
              do {
                local_98.Area = fVar21;
                if ((pAVar14->Ins[uVar13] < '\0') ||
                   (uVar19 = *(uint *)((long)&pAVar15[1].field_0x0 +
                                      (ulong)((byte)pAVar14->Ins[uVar13] & 0xfffffffe) * 2),
                   (int)uVar19 < 0)) {
LAB_00442d62:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar19 = uVar19 >> 1;
                if (p->vObjs->nSize <= (int)uVar19) goto LAB_00442d81;
                pvVar5 = p->vObjs->pArray[uVar19];
                iVar17 = (int)*(float *)((long)pvVar5 + 0x58);
                if ((int)*(float *)((long)pvVar5 + 0x58) < (int)fVar30) {
                  iVar17 = (int)fVar30;
                }
                fVar30 = *(float *)((long)pvVar5 + 0x50);
                iVar18 = *(int *)((long)pvVar5 + 0x38) + *(int *)((long)pvVar5 + 0x34);
                if (iVar18 != 0) {
                  fVar30 = fVar30 / *(float *)((long)pvVar5 + 0x30);
                }
                local_98.Area = 1e+32;
                if (fVar22 < 1e+32 && fVar30 < 1e+32) {
                  local_98.Area = fVar22 + fVar30;
                }
                fVar30 = (float)iVar17;
                fVar29 = fVar29 + (float)iVar18;
                uVar13 = uVar13 + 1;
                fVar22 = local_98.Area;
              } while (bVar1 != uVar13);
              fVar30 = fVar30 + 1.0;
            }
            fVar29 = fVar29 / (float)bVar1;
            local_98.AveFan = fVar29;
            local_98.Delay = fVar30;
          }
          AVar8 = SUB84(uVar9,0);
          if (local_78 == (Amap_Cut_t *)0x0) {
LAB_00442b60:
            auStack_68._4_4_ = local_98.AveFan;
            auStack_68._0_4_ = local_98.Area;
            fStack_60 = local_98.Delay;
            uStack_5c = local_98._28_4_;
            local_78 = local_98.pCut;
            pAStack_70 = local_98.pSet;
          }
          else {
            fVar21 = p->pPars->fEpsilon;
            if ((fVar30 - fVar21 <= fStack_60) &&
               ((fVar21 + fVar30 < fStack_60 ||
                ((local_98.Area - fVar21 <= (float)auStack_68._0_4_ &&
                 ((fVar21 + local_98.Area < (float)auStack_68._0_4_ ||
                  ((float)auStack_68._4_4_ <= fVar29 - fVar21)))))))) goto LAB_00442b60;
          }
          if (local_58 == (Amap_Cut_t *)0x0) {
LAB_00442b9f:
            uStack_48 = CONCAT44(local_98.AveFan,local_98.Area);
            uStack_40 = CONCAT44(local_98._28_4_,local_98.Delay);
            local_58 = local_98.pCut;
            pAStack_50 = local_98.pSet;
          }
          else {
            fVar21 = p->pPars->fEpsilon;
            if ((local_98.Area - fVar21 <= (float)uStack_48) &&
               ((local_98.Area + fVar21 < (float)uStack_48 ||
                ((uStack_48._4_4_ <= fVar29 - fVar21 &&
                 ((uStack_48._4_4_ < fVar29 + fVar21 || (fVar30 - fVar21 <= (float)uStack_40))))))))
            goto LAB_00442b9f;
          }
          pAVar14 = pAVar14->pNext;
        } while (pAVar14 != (Amap_Set_t *)0x0);
        uVar19 = pNode->nCuts;
      }
      iVar7 = iVar7 + 1;
      pAVar15 = pAVar15 + (ulong)((uint)AVar8 >> 0x11) + 1;
    } while (iVar7 < (int)uVar19);
    fVar30 = (float)auStack_68._0_4_;
    fVar29 = (float)uStack_40;
    uVar20 = uStack_5c;
    fVar21 = (float)uStack_48;
    fVar22 = fStack_60;
  }
  fVar21 = fVar21 - fVar30;
  fVar28 = fVar29 - fVar22;
  auVar26._0_8_ = CONCAT44(0x80000000,-fVar21);
  auVar26._8_4_ = 0x80000000;
  auVar26._12_4_ = 0x80000000;
  fVar27 = -fVar28;
  if (-fVar28 <= fVar28) {
    fVar27 = fVar28;
  }
  if (-fVar21 <= fVar21) {
    auVar23._4_12_ = auVar26._4_12_;
    auVar23._0_4_ = fVar21;
    auVar26._0_8_ = auVar23._0_8_;
  }
  auVar25._8_4_ = (int)((ulong)auVar26._0_8_ >> 0x20);
  auVar25._0_8_ = auVar26._0_8_;
  auVar25._12_4_ = -fVar29;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._0_4_ = (undefined4)auVar26._0_8_;
  auVar24._4_4_ = fVar27 * p->pPars->fADratio;
  auVar6._4_4_ = fVar29;
  auVar6._0_4_ = fVar30;
  auVar6._8_4_ = fVar22;
  auVar6._12_4_ = uVar20;
  auVar26 = divps(auVar24,auVar6);
  ppAVar11 = &local_58;
  if (auVar26._0_4_ < auVar26._4_4_) {
    ppAVar11 = &local_78;
  }
  *(ulong *)pNode =
       *(ulong *)pNode & 0x7fffffffffffffff |
       (ulong)(((uint)ppAVar11[1][2] ^ (uint)**ppAVar11) >> 0x10) << 0x3f;
  pAVar14 = (Amap_Set_t *)ppAVar11[1];
  pAVar15 = ppAVar11[2];
  pAVar10 = ppAVar11[3];
  (pNode->Best).pCut = *ppAVar11;
  (pNode->Best).pSet = pAVar14;
  *(Amap_Cut_t **)&(pNode->Best).Area = pAVar15;
  *(Amap_Cut_t **)&(pNode->Best).Delay = pAVar10;
  pAVar15 = (pNode->Best).pCut;
  __n = (ulong)((uint)*pAVar15 >> 0x11) * 4 + 4;
  pAVar10 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCutBest,(int)__n);
  memcpy(pAVar10,pAVar15,__n);
  (pNode->Best).pCut = pAVar10;
  if ((fRefs != 0) &&
     (iVar7 = pNode->nFouts[1] + pNode->nFouts[0],
     iVar7 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar7 < 0)) {
    Amap_CutAreaRef(p,&pNode->Best);
    return;
  }
  return;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}